

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdso_support.cc
# Opt level: O1

void __thiscall absl::lts_20250127::debugging_internal::VDSOSupport::VDSOSupport(VDSOSupport *this)

{
  undefined *base;
  
  base = vdso_base_;
  if ((undefined4 *)vdso_base_ == &ElfMemImage::kInvalidBaseSentinel) {
    base = (undefined *)Init();
  }
  ElfMemImage::ElfMemImage(&this->image_,base);
  return;
}

Assistant:

VDSOSupport::VDSOSupport()
    // If vdso_base_ is still set to kInvalidBase, we got here
    // before VDSOSupport::Init has been called. Call it now.
    : image_(vdso_base_.load(std::memory_order_relaxed) ==
                     debugging_internal::ElfMemImage::kInvalidBase
                 ? Init()
                 : vdso_base_.load(std::memory_order_relaxed)) {}